

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<Catch::AssertionResult> * __thiscall
Catch::Option<Catch::AssertionResult>::operator=
          (Option<Catch::AssertionResult> *this,AssertionResult *_value)

{
  AssertionResult *_value_local;
  Option<Catch::AssertionResult> *this_local;
  
  reset(this);
  AssertionResult::AssertionResult((AssertionResult *)this->storage,_value);
  this->nullableValue = (AssertionResult *)this->storage;
  return this;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }